

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

DataChunk * duckdb::SortKeyLeastGreatest::Prepare(DataChunk *args,ExpressionState *state)

{
  DataChunk *this;
  undefined4 uVar1;
  idx_t input_count;
  optional_ptr<duckdb::FunctionLocalState,_true> oVar2;
  reference input;
  reference result;
  size_type __n;
  optional_ptr<duckdb::FunctionLocalState,_true> local_38;
  
  local_38.ptr = (FunctionLocalState *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid(&local_38);
  oVar2.ptr = local_38.ptr;
  this = (DataChunk *)(local_38.ptr + 1);
  DataChunk::Reset(this);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      input = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      input_count = args->count;
      uVar1 = *(undefined4 *)&oVar2.ptr[0x16]._vptr_FunctionLocalState;
      result = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this,__n);
      CreateSortKeyHelpers::CreateSortKey(input,input_count,SUB42(uVar1,0),result);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  oVar2.ptr[4]._vptr_FunctionLocalState = (_func_int **)args->count;
  return this;
}

Assistant:

static DataChunk &Prepare(DataChunk &args, ExpressionState &state) {
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<LeastGreatestSortKeyState>();
		lstate.sort_keys.Reset();
		for (idx_t c_idx = 0; c_idx < args.ColumnCount(); c_idx++) {
			CreateSortKeyHelpers::CreateSortKey(args.data[c_idx], args.size(), lstate.modifiers,
			                                    lstate.sort_keys.data[c_idx]);
		}
		lstate.sort_keys.SetCardinality(args.size());
		return lstate.sort_keys;
	}